

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  char *__s;
  LargestUInt in_RDX;
  string local_1e0;
  ostringstream local_1c0 [8];
  ostringstream oss;
  allocator<char> local_42;
  allocator local_41;
  char *local_40;
  char *this_str;
  allocator<char> local_2d;
  uint this_len;
  allocator<char> local_19;
  Value *local_18;
  Value *this_local;
  
  local_18 = this;
  this_local = (Value *)__return_storage_ptr__;
  switch(this->field_0x8) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case 1:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,in_RDX);
    break;
  case 2:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,in_RDX);
    break;
  case 3:
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)this,(this->value_).real_);
    break;
  case 4:
    if ((this->value_).int_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_2d);
      std::allocator<char>::~allocator(&local_2d);
    }
    else {
      decodePrefixedString
                ((bool)((byte)((ushort)*(undefined2 *)&this->field_0x8 >> 8) & 1),
                 (this->value_).string_,(uint *)((long)&this_str + 4),&local_40);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,local_40,(ulong)this_str._4_4_,&local_41);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    break;
  case 5:
    __s = "false";
    if (((this->value_).bool_ & 1U) != 0) {
      __s = "true";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_42);
    std::allocator<char>::~allocator(&local_42);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_1c0);
    std::operator<<((ostream *)local_1c0,"Type is not convertible to string");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1e0);
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
  {
    if (value_.string_ == 0) return "";
    unsigned this_len;
    char const* this_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    return JSONCPP_STRING(this_str, this_len);
  }
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}